

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_api.c
# Opt level: O0

MPP_RET h265e_add_sei(MppPacket pkt,RK_S32 *length,RK_U8 *uuid,void *data,RK_S32 size)

{
  size_t sVar1;
  int local_44;
  MPP_RET local_40;
  RK_U32 recovery_frame_cnt;
  RK_U32 new_length;
  RK_U32 offset;
  RK_U8 *ptr;
  int *piStack_28;
  RK_S32 size_local;
  void *data_local;
  RK_U8 *uuid_local;
  RK_S32 *length_local;
  MppPacket pkt_local;
  
  ptr._4_4_ = size;
  piStack_28 = (int *)data;
  data_local = uuid;
  uuid_local = (RK_U8 *)length;
  length_local = (RK_S32 *)pkt;
  _new_length = mpp_packet_get_pos(pkt);
  sVar1 = mpp_packet_get_length(length_local);
  recovery_frame_cnt = (RK_U32)sVar1;
  local_40 = 0;
  _new_length = (void *)((long)_new_length + (sVar1 & 0xffffffff));
  if ((RK_U8 *)data_local == uuid_refresh_cfg) {
    local_44 = *piStack_28 + -1;
    local_40 = h265e_sei_recovery_point(_new_length,uuid_refresh_cfg,&local_44,0);
  }
  else {
    local_40 = h265e_data_to_sei(_new_length,(RK_U8 *)data_local,piStack_28,ptr._4_4_);
  }
  *(MPP_RET *)uuid_local = local_40;
  mpp_packet_set_length(length_local,(ulong)(uint)(recovery_frame_cnt + local_40));
  mpp_packet_add_segment_info(length_local,0x27,recovery_frame_cnt,local_40);
  return MPP_OK;
}

Assistant:

static MPP_RET h265e_add_sei(MppPacket pkt, RK_S32 *length, RK_U8 uuid[16],
                             const void *data, RK_S32 size)
{
    RK_U8 *ptr = mpp_packet_get_pos(pkt);
    RK_U32 offset = mpp_packet_get_length(pkt);
    RK_U32 new_length = 0;

    ptr += offset;

    if (uuid == uuid_refresh_cfg) {
        RK_U32 recovery_frame_cnt = ((RK_U32 *)data)[0] - 1;
        new_length = h265e_sei_recovery_point(ptr, uuid, &recovery_frame_cnt, 0);
    } else {
        new_length = h265e_data_to_sei(ptr, uuid, data, size);
    }
    *length = new_length;

    mpp_packet_set_length(pkt, offset + new_length);
    mpp_packet_add_segment_info(pkt, NAL_SEI_PREFIX, offset, new_length);

    return MPP_OK;
}